

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

int64_t __thiscall
aeron::archive::AeronArchive::awaitSessionOpened(AeronArchive *this,int64_t correlationId)

{
  element_type *peVar1;
  ClientConductor *this_00;
  Value __val;
  long lVar2;
  int64_t iVar3;
  SourcedException *pSVar4;
  string *__rhs;
  long *plVar5;
  char *pcVar6;
  size_type *psVar7;
  TimePoint *deadline_00;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  allocator local_f9;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  TimePoint local_38;
  
  deadline_00 = (TimePoint *)correlationId;
  lVar2 = std::chrono::_V2::system_clock::now();
  local_38.__d.__r = (duration)(lVar2 + (this->messageTimeoutNs_).__r);
  awaitConnection(this,deadline_00);
  do {
    pollNextResponse(this,correlationId,&local_38);
    iVar3 = ControlResponsePoller::correlationId
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (iVar3 == correlationId) {
      iVar3 = ControlResponsePoller::templateId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      if (iVar3 == 1) {
        __val = ControlResponsePoller::code
                          ((this->controlResponsePoller_)._M_t.
                           super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                           _M_head_impl);
        if (__val == OK) {
          iVar3 = ControlResponsePoller::controlSessionId
                            ((this->controlResponsePoller_)._M_t.
                             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                             _M_head_impl);
          return iVar3;
        }
        if (__val == ERROR) {
          pSVar4 = (SourcedException *)__cxa_allocate_exception(0x48);
          __rhs = ControlResponsePoller::errorMessage_abi_cxx11_
                            ((this->controlResponsePoller_)._M_t.
                             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                             _M_head_impl);
          std::operator+(&local_d8,"unexpected response: ",__rhs);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_f8._M_dataplus._M_p = (pointer)*plVar5;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_f8._M_dataplus._M_p == psVar7) {
            local_f8.field_2._M_allocated_capacity = *psVar7;
            local_f8.field_2._8_8_ = plVar5[3];
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar7;
          }
          local_f8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          iVar3 = ControlResponsePoller::relevantId
                            ((this->controlResponsePoller_)._M_t.
                             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                             _M_head_impl);
          std::__cxx11::to_string(&local_b8,iVar3);
          std::operator+(&local_98,&local_f8,&local_b8);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,
                     "std::int64_t aeron::archive::AeronArchive::awaitSessionOpened(std::int64_t)",
                     "");
          pcVar6 = aeron::util::past_prefix
                             ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                             );
          std::__cxx11::string::string((string *)&local_58,pcVar6,&local_f9);
          aeron::util::SourcedException::SourcedException
                    (pSVar4,&local_98,&local_78,&local_58,0x147);
          *(undefined ***)pSVar4 = &PTR__SourcedException_00162228;
          __cxa_throw(pSVar4,&ArchiveException::typeinfo,
                      aeron::util::SourcedException::~SourcedException);
        }
        pSVar4 = (SourcedException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_f8,__val);
        std::operator+(&local_98,"unexpected response: code=",&local_f8);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,
                   "std::int64_t aeron::archive::AeronArchive::awaitSessionOpened(std::int64_t)","")
        ;
        pcVar6 = aeron::util::past_prefix
                           ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                           );
        std::__cxx11::string::string((string *)&local_b8,pcVar6,(allocator *)&local_78);
        aeron::util::SourcedException::SourcedException(pSVar4,&local_98,&local_d8,&local_b8,0x14a);
        *(undefined ***)pSVar4 = &PTR__SourcedException_00162228;
        __cxa_throw(pSVar4,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
    }
    peVar1 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1->m_conductorInvoker).m_isRunning == true) {
      this_00 = (peVar1->m_conductorInvoker).m_agent;
      DriverListenerAdapter<aeron::ClientConductor>::receiveMessages
                (&this_00->m_driverListenerAdapter);
      ClientConductor::onHeartbeatCheckTimeouts(this_00);
    }
  } while( true );
}

Assistant:

std::int64_t AeronArchive::awaitSessionOpened(std::int64_t correlationId) {
    auto deadline = Clock::now() + messageTimeoutNs_;

    awaitConnection(deadline);

    while (true) {
        pollNextResponse(correlationId, deadline);

        if (controlResponsePoller_->correlationId() != correlationId ||
            controlResponsePoller_->templateId() != codecs::ControlResponse::sbeTemplateId()) {
            aeron_->conductorAgentInvoker().invoke();
            continue;
        }

        auto code = controlResponsePoller_->code();
        if (code != codecs::ControlResponseCode::OK) {
            if (code == codecs::ControlResponseCode::ERROR) {
                throw ArchiveException("unexpected response: " + controlResponsePoller_->errorMessage() +
                                           ", relevant id: " + std::to_string(controlResponsePoller_->relevantId()),
                                       SOURCEINFO);
            }

            throw ArchiveException("unexpected response: code=" + std::to_string(code), SOURCEINFO);
        }

        return controlResponsePoller_->controlSessionId();
    }
}